

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall
sptk::reaper::EpochTracker::NormalizeAmplitude
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          vector<float,_std::allocator<float>_> *output)

{
  int32_t iVar1;
  int32_t iVar2;
  size_type sVar3;
  vector<float,_std::allocator<float>_> *this_00;
  reference pvVar4;
  const_reference pvVar5;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  size_type in_RDI;
  float in_XMM0_Da;
  double dVar6;
  int i_1;
  double delta_inv_rms;
  double inv_rms;
  double val;
  int32_t i;
  double ref_energy;
  double old_inv_rms;
  int32_t frame_p;
  int32_t data_p;
  int32_t frame_limit;
  int32_t limit;
  int32_t frame_step;
  int32_t ref_by_2;
  vector<float,_std::allocator<float>_> wind;
  int32_t ref_size;
  int32_t n_input;
  undefined4 in_stack_ffffffffffffff40;
  value_type vVar7;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  double local_98;
  float *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff84;
  int iVar8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff88;
  double dVar9;
  EpochTracker *in_stack_ffffffffffffff90;
  double dVar10;
  int local_64;
  int local_60;
  int local_5c;
  
  sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  iVar1 = RoundUp(in_XMM0_Da * *(float *)(in_RDI + 0x1b4));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x12213f);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RDI);
  this_00 = (vector<float,_std::allocator<float>_> *)(long)iVar1;
  std::vector<float,_std::allocator<float>_>::front
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Window(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
         in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  iVar2 = RoundUp(in_XMM0_Da * *(float *)(in_RDI + 0x174));
  local_60 = 0;
  dVar10 = 0.0;
  local_5c = iVar1 / 2;
  for (local_64 = 0; local_64 < (int)sVar3 - iVar1; local_64 = iVar2 + local_64) {
    dVar9 = 1.0;
    dVar6 = dVar10;
    for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x110),(long)iVar8);
      vVar7 = *pvVar4;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         (in_RSI,(long)(iVar8 + local_64));
      dVar9 = (double)(vVar7 * *pvVar5) * (double)(vVar7 * *pvVar5) + dVar9;
    }
    dVar10 = sqrt((double)iVar1 / dVar9);
    local_98 = 0.0;
    if (0 < local_64) {
      local_98 = (dVar10 - dVar6) / (double)iVar2;
      dVar10 = dVar6;
    }
    for (iVar8 = 0; iVar8 < local_5c; iVar8 = iVar8 + 1) {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_60);
      dVar6 = (double)*pvVar5 * dVar10;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,(long)local_60);
      *pvVar4 = (float)dVar6;
      dVar10 = local_98 + dVar10;
      local_60 = local_60 + 1;
    }
    local_5c = iVar2;
  }
  for (; local_60 < (int)sVar3; local_60 = local_60 + 1) {
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_60);
    dVar6 = (double)*pvVar5 * dVar10;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,(long)local_60);
    *pvVar4 = (float)dVar6;
  }
  std::vector<float,_std::allocator<float>_>::~vector(this_00);
  return;
}

Assistant:

void EpochTracker::NormalizeAmplitude(const std::vector<float>& input,
                                      float sample_rate,
                                      std::vector<float>* output) {
  int32_t n_input = input.size();
  int32_t ref_size = RoundUp(sample_rate * ref_dur_);
  std::vector<float> wind;

  output->resize(n_input);
  // Just calling Window here to create a Hann window in window_.
  Window(input, 0, ref_size, &(output->front()));
  int32_t ref_by_2 = ref_size / 2;
  int32_t frame_step = RoundUp(sample_rate * internal_frame_interval_);
  int32_t limit = n_input - ref_size;
  int32_t frame_limit = ref_by_2;
  int32_t data_p = 0;
  int32_t frame_p = 0;
  double old_inv_rms = 0.0;
  while (frame_p < limit) {
    double ref_energy = 1.0;  // to prevent divz
    for (int32_t i = 0; i < ref_size; ++i) {
      double val = window_[i] * input[i + frame_p];
      ref_energy += (val * val);
    }
    double inv_rms = sqrt(static_cast<double>(ref_size) / ref_energy);
    double delta_inv_rms = 0.0;
    if (frame_p > 0) {
      delta_inv_rms = (inv_rms - old_inv_rms) / frame_step;
    } else {
      old_inv_rms = inv_rms;
    }
    for (int i = 0; i < frame_limit; ++i, ++data_p) {
      (*output)[data_p] = input[data_p] * old_inv_rms;
      old_inv_rms += delta_inv_rms;
    }
    frame_limit = frame_step;
    frame_p += frame_step;
  }
  for ( ; data_p < n_input; ++data_p) {
    (*output)[data_p] = input[data_p] * old_inv_rms;
  }
}